

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O0

QPDFObjectHandle __thiscall QPDF::copyForeignObject(QPDF *this,QPDFObjectHandle *foreign)

{
  mapped_type *this_00;
  bool bVar1;
  logic_error *plVar2;
  QPDFObjectHandle *pQVar3;
  pointer pMVar4;
  pointer pMVar5;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *this_01;
  size_type sVar6;
  qpdf_offset_t offset;
  mapped_type *pmVar7;
  QPDFObjectHandle *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  QPDFObjectHandle QVar9;
  QPDFObjGen local_214;
  allocator<char> local_209;
  string local_208;
  string local_1e8;
  string local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  QPDFExc local_168;
  QPDFObjGen local_e8;
  QPDFObjGen og;
  QPDFObjectHandle local_d0;
  QPDFObjGen local_c0;
  QPDFObjGen og_1;
  undefined1 local_a8 [8];
  QPDFObjectHandle copy;
  QPDFObjectHandle *to_copy;
  iterator __end1;
  iterator __begin1;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *__range1;
  mapped_type *local_68;
  ObjCopier *obj_copier;
  string local_58;
  QPDFObjectHandle *local_38;
  QPDF *other;
  QPDFObjectHandle *foreign_local;
  QPDF *this_local;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  
  foreign_local = foreign;
  this_local = this;
  bVar1 = QPDFObjectHandle::isIndirect(in_RDX);
  if (!bVar1) {
    QTC::TC("qpdf","QPDF copyForeign direct",0);
    plVar2 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar2,"QPDF::copyForeign called with direct object handle");
    __cxa_throw(plVar2,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"",(allocator<char> *)((long)&obj_copier + 7));
  pQVar3 = (QPDFObjectHandle *)QPDFObjectHandle::getQPDF(in_RDX,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)((long)&obj_copier + 7));
  local_38 = pQVar3;
  if (pQVar3 == foreign) {
    QTC::TC("qpdf","QPDF copyForeign not foreign",0);
    plVar2 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar2,"QPDF::copyForeign called with object from this QPDF");
    __cxa_throw(plVar2,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  pMVar4 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                     ((unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_> *)foreign);
  pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                     ((unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_> *)local_38);
  local_68 = std::
             map<unsigned_long_long,_QPDF::ObjCopier,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_QPDF::ObjCopier>_>_>
             ::operator[](&pMVar4->object_copiers,&pMVar5->unique_id);
  bVar1 = std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>::empty
                    (&(local_68->visiting).
                      super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>);
  if (!bVar1) {
    plVar2 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              (plVar2,"obj_copier.visiting is not empty at the beginning of copyForeignObject");
    __cxa_throw(plVar2,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)&__range1,in_RDX);
  reserveObjects((QPDF *)foreign,(QPDFObjectHandle *)&__range1,local_68,true);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&__range1);
  bVar1 = std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>::empty
                    (&(local_68->visiting).
                      super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>);
  if (!bVar1) {
    plVar2 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar2,"obj_copier.visiting is not empty after reserving objects")
    ;
    __cxa_throw(plVar2,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  this_01 = &local_68->to_copy;
  __end1 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::begin(this_01);
  to_copy = (QPDFObjectHandle *)
            std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::end(this_01);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                                *)&to_copy);
    if (!bVar1) break;
    copy.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             __gnu_cxx::
             __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
             ::operator*(&__end1);
    QPDFObjectHandle::QPDFObjectHandle
              ((QPDFObjectHandle *)&og_1,
               (QPDFObjectHandle *)
               copy.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    replaceForeignIndirectObjects((QPDF *)local_a8,foreign,(ObjCopier *)&og_1,SUB81(local_68,0));
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&og_1);
    bVar1 = QPDFObjectHandle::isStream
                      ((QPDFObjectHandle *)
                       copy.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
    if (!bVar1) {
      local_c0 = QPDFObjectHandle::getObjGen
                           ((QPDFObjectHandle *)
                            copy.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                            _M_pi);
      pmVar7 = std::
               map<QPDFObjGen,_QPDFObjectHandle,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>_>
               ::operator[](&local_68->object_map,&local_c0);
      QPDFObjectHandle::QPDFObjectHandle(&local_d0,pmVar7);
      QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)&og,(QPDFObjectHandle *)local_a8);
      replaceReserved((QPDF *)foreign,&local_d0,(QPDFObjectHandle *)&og);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&og);
      QPDFObjectHandle::~QPDFObjectHandle(&local_d0);
    }
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_a8);
    __gnu_cxx::
    __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
    ::operator++(&__end1);
  }
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::clear(&local_68->to_copy);
  local_e8 = QPDFObjectHandle::getObjGen(in_RDX);
  sVar6 = std::
          map<QPDFObjGen,_QPDFObjectHandle,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>_>
          ::count(&local_68->object_map,&local_e8);
  this_00 = local_68;
  if (sVar6 == 0) {
    getFilename_abi_cxx11_(&local_1c8,(QPDF *)local_38);
    std::operator+(&local_1a8,&local_1c8," object ");
    QPDFObjGen::unparse_abi_cxx11_(&local_1e8,&local_e8,' ');
    std::operator+(&local_188,&local_1a8,&local_1e8);
    offset = QPDFObjectHandle::getParsedOffset(in_RDX);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,
               "unexpected reference to /Pages object while copying foreign object; replacing with null"
               ,&local_209);
    damagedPDF(&local_168,(QPDF *)foreign,&local_188,offset,&local_208);
    warn((QPDF *)foreign,&local_168);
    QPDFExc::~QPDFExc(&local_168);
    std::__cxx11::string::~string((string *)&local_208);
    std::allocator<char>::~allocator(&local_209);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_1c8);
    QVar9 = QPDFObjectHandle::newNull();
    _Var8._M_pi = QVar9.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  }
  else {
    local_214 = QPDFObjectHandle::getObjGen(in_RDX);
    pmVar7 = std::
             map<QPDFObjGen,_QPDFObjectHandle,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>_>
             ::operator[](&this_00->object_map,&local_214);
    QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)this,pmVar7);
    _Var8._M_pi = extraout_RDX;
  }
  QVar9.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var8._M_pi;
  QVar9.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar9.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDF::copyForeignObject(QPDFObjectHandle foreign)
{
    // Here's an explanation of what's going on here.
    //
    // A QPDFObjectHandle that is an indirect object has an owning QPDF. The object ID and
    // generation refers to an object in the owning QPDF. When we copy the QPDFObjectHandle from a
    // foreign QPDF into the local QPDF, we have to replace all indirect object references with
    // references to the corresponding object in the local file.
    //
    // To do this, we maintain mappings from foreign object IDs to local object IDs for each foreign
    // QPDF that we are copying from. The mapping is stored in an ObjCopier, which contains a
    // mapping from the foreign ObjGen to the local QPDFObjectHandle.
    //
    // To copy, we do a deep traversal of the foreign object with loop detection to discover all
    // indirect objects that are encountered, stopping at page boundaries. Whenever we encounter an
    // indirect object, we check to see if we have already created a local copy of it. If not, we
    // allocate a "reserved" object (or, for a stream, just a new stream) and store in the map the
    // mapping from the foreign object ID to the new object. While we
    // do this, we keep a list of objects to copy.
    //
    // Once we are done with the traversal, we copy all the objects that we need to copy. However,
    // the copies will contain indirect object IDs that refer to objects in the foreign file. We
    // need to replace them with references to objects in the local file. This is what
    // replaceForeignIndirectObjects does. Once we have created a copy of the foreign object with
    // all the indirect references replaced with new ones in the local context, we can replace the
    // local reserved object with the copy. This mechanism allows us to copy objects with circular
    // references in any order.

    // For streams, rather than copying the objects, we set up the stream data to pull from the
    // original stream by using a stream data provider. This is done in a manner that doesn't
    // require the original QPDF object but may require the original source of the stream data with
    // special handling for immediate_copy_from. This logic is also in
    // replaceForeignIndirectObjects.

    // Note that we explicitly allow use of copyForeignObject on page objects. It is a documented
    // use case to copy pages this way if the intention is to not update the pages tree.
    if (!foreign.isIndirect()) {
        QTC::TC("qpdf", "QPDF copyForeign direct");
        throw std::logic_error("QPDF::copyForeign called with direct object handle");
    }
    QPDF& other = foreign.getQPDF();
    if (&other == this) {
        QTC::TC("qpdf", "QPDF copyForeign not foreign");
        throw std::logic_error("QPDF::copyForeign called with object from this QPDF");
    }

    ObjCopier& obj_copier = m->object_copiers[other.m->unique_id];
    if (!obj_copier.visiting.empty()) {
        throw std::logic_error(
            "obj_copier.visiting is not empty at the beginning of copyForeignObject");
    }

    // Make sure we have an object in this file for every referenced object in the old file.
    // obj_copier.object_map maps foreign QPDFObjGen to local objects.  For everything new that we
    // have to copy, the local object will be a reservation, unless it is a stream, in which case
    // the local object will already be a stream.
    reserveObjects(foreign, obj_copier, true);

    if (!obj_copier.visiting.empty()) {
        throw std::logic_error("obj_copier.visiting is not empty after reserving objects");
    }

    // Copy any new objects and replace the reservations.
    for (auto& to_copy: obj_copier.to_copy) {
        QPDFObjectHandle copy = replaceForeignIndirectObjects(to_copy, obj_copier, true);
        if (!to_copy.isStream()) {
            QPDFObjGen og(to_copy.getObjGen());
            replaceReserved(obj_copier.object_map[og], copy);
        }
    }
    obj_copier.to_copy.clear();

    auto og = foreign.getObjGen();
    if (!obj_copier.object_map.count(og)) {
        warn(damagedPDF(
            other.getFilename() + " object " + og.unparse(' '),
            foreign.getParsedOffset(),
            "unexpected reference to /Pages object while copying foreign object; replacing with "
            "null"));
        return QPDFObjectHandle::newNull();
    }
    return obj_copier.object_map[foreign.getObjGen()];
}